

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall message_header_write_read::test_method(message_header_write_read *this)

{
  buffer_reader *reader_00;
  shared_count *this_00;
  message_id id;
  message_header write_header;
  message_header read_header;
  message_size size;
  assertion_result local_130;
  char *local_118;
  char *local_110;
  buffer buffer;
  binary_expr<boost::test_tools::assertion::value_expr<message_id_&>,_const_message_id_&,_boost::test_tools::assertion::op::EQ<message_id,_message_id,_void>_>
  local_e8;
  buffer_writer writer;
  buffer_reader reader;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  lazy_ostream local_70;
  undefined1 *local_60;
  char **local_58;
  const_string local_50;
  const_string local_40;
  
  size = 0xff55;
  id = PING;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  write_header.size = 0xff55;
  write_header.id = PING;
  buffer_writer::buffer_writer(&writer,&buffer);
  ::operator<<(&writer,&write_header);
  buffer_reader::buffer_reader(&reader,&buffer);
  reader_00 = &reader;
  ::operator>>(reader_00,&read_header);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)reader_00,&local_40,0x76,&local_50);
  local_e8.m_lhs.m_value = &read_header.id;
  local_e8.m_rhs = &id;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<message_id_&>,_const_message_id_&,_boost::test_tools::assertion::op::EQ<message_id,_message_id,_void>_>
  ::evaluate(&local_130,&local_e8,false);
  local_118 = "read_header.id == id";
  local_110 = "";
  local_70.m_empty = false;
  local_70._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_80.m_end = "";
  local_58 = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_130,&local_70,&local_80,0x76,CHECK,CHECK_BUILT_ASSERTION,0);
  this_00 = &local_130.m_message.pn;
  boost::detail::shared_count::~shared_count(this_00);
  local_90.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_90.m_end = "";
  local_a0.m_begin = "";
  local_a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_90,0x77,&local_a0);
  local_e8.m_lhs.m_value = (message_id *)&read_header;
  local_e8.m_rhs = (message_id *)&size;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int_&>,_const_unsigned_int_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
  ::evaluate(&local_130,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_int_&>,_const_unsigned_int_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
              *)&local_e8,false);
  local_118 = "read_header.size == size";
  local_110 = "";
  local_70.m_empty = false;
  local_70._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_b0.m_end = "";
  local_58 = &local_118;
  boost::test_tools::tt_detail::report_assertion
            (&local_130,&local_70,&local_b0,0x77,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(message_header_write_read)
{
    const message_size size = 0xFF55;
    const message_id id = message_id::PING;
    buffer buffer;

    message_header write_header;
    write_header.size = size;
    write_header.id = id;

    buffer_writer writer(buffer);
    writer << write_header;

    buffer_reader reader(buffer);
    message_header read_header;
    reader >> read_header;

    BOOST_TEST(read_header.id == id);
    BOOST_TEST(read_header.size == size);
}